

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeAddOpList(Vdbe *p,int nOp,VdbeOpList *aOp)

{
  char cVar1;
  byte bVar2;
  Op *pOVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  if ((p->nOpAlloc < p->nOp + nOp) && (iVar4 = growOpArray(p), iVar4 != 0)) {
    return 0;
  }
  iVar4 = p->nOp;
  if (0 < nOp) {
    lVar5 = (long)iVar4 * 0x18;
    uVar6 = 0;
    do {
      cVar1 = aOp[uVar6].p2;
      uVar7 = (uint)cVar1;
      pOVar3 = p->aOp;
      bVar2 = aOp[uVar6].opcode;
      (&pOVar3->opcode)[lVar5] = bVar2;
      *(int *)((long)&pOVar3->p1 + lVar5) = (int)aOp[uVar6].p1;
      if ((cVar1 < '\0') && ((""[bVar2] & 1) != 0)) {
        uVar7 = ~uVar7 + iVar4;
      }
      *(uint *)((long)&pOVar3->p2 + lVar5) = uVar7;
      *(int *)((long)&pOVar3->p3 + lVar5) = (int)aOp[uVar6].p3;
      (&pOVar3->p4type)[lVar5] = '\0';
      *(undefined8 *)((long)&pOVar3->p4 + lVar5) = 0;
      (&pOVar3->p5)[lVar5] = '\0';
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x18;
    } while ((uint)nOp != uVar6);
  }
  p->nOp = p->nOp + nOp;
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOpList(Vdbe *p, int nOp, VdbeOpList const *aOp){
  int addr;
  assert( p->magic==VDBE_MAGIC_INIT );
  if( p->nOp + nOp > p->nOpAlloc && growOpArray(p) ){
    return 0;
  }
  addr = p->nOp;
  if( ALWAYS(nOp>0) ){
    int i;
    VdbeOpList const *pIn = aOp;
    for(i=0; i<nOp; i++, pIn++){
      int p2 = pIn->p2;
      VdbeOp *pOut = &p->aOp[i+addr];
      pOut->opcode = pIn->opcode;
      pOut->p1 = pIn->p1;
      if( p2<0 && (sqlite3OpcodeProperty[pOut->opcode] & OPFLG_JUMP)!=0 ){
        pOut->p2 = addr + ADDR(p2);
      }else{
        pOut->p2 = p2;
      }
      pOut->p3 = pIn->p3;
      pOut->p4type = P4_NOTUSED;
      pOut->p4.p = 0;
      pOut->p5 = 0;
#ifdef SQLITE_DEBUG
      pOut->zComment = 0;
      if( p->db->flags & SQLITE_VdbeAddopTrace ){
        sqlite3VdbePrintOp(0, i+addr, &p->aOp[i+addr]);
      }
#endif
    }
    p->nOp += nOp;
  }
  return addr;
}